

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OclLaunchData.cpp
# Opt level: O2

void __thiscall
xmrig::OclLaunchData::OclLaunchData
          (OclLaunchData *this,Miner *miner,OclConfig *config,OclPlatform *platform,
          OclThread *thread,OclDevice *device,int64_t affinity)

{
  size_t sVar1;
  
  this->ctx = (cl_context)0x0;
  this->cache = config->m_cache;
  this->affinity = affinity;
  this->miner = miner;
  OclDevice::OclDevice(&this->device,device);
  sVar1 = platform->m_index;
  (this->platform).m_id = platform->m_id;
  (this->platform).m_index = sVar1;
  OclThread::OclThread(&this->thread,thread);
  return;
}

Assistant:

xmrig::OclLaunchData::OclLaunchData(const Miner *miner, const OclConfig &config, const OclPlatform &platform, const OclThread &thread, const OclDevice &device, int64_t affinity) :
    cache(config.isCacheEnabled()),
    affinity(affinity),
    miner(miner),
    device(device),
    platform(platform),
    thread(thread)
{
}